

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

longdouble * get_big_float(longdouble *__return_storage_ptr__,FMFieldPtr field,void *data)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  longdouble *extraout_RAX;
  longdouble *plVar5;
  longdouble *extraout_RAX_00;
  undefined4 extraout_var;
  longdouble *extraout_RAX_01;
  undefined4 extraout_var_00;
  uint uVar6;
  float *data_00;
  float tmp;
  char acStack_34 [4];
  undefined8 uStack_30;
  
  data_00 = &tmp;
  uVar6 = *(uint *)((long)__return_storage_ptr__ + 0xc);
  plVar5 = (longdouble *)(ulong)uVar6;
  if (uVar6 == 1) {
    plVar5 = (longdouble *)get_big_int((FMFieldPtr)__return_storage_ptr__,field);
  }
  else if (uVar6 == 2) {
    plVar5 = (longdouble *)get_big_unsigned((FMFieldPtr)__return_storage_ptr__,field);
  }
  else {
    if (uVar6 != 3) {
      fwrite("Get Double failed on invalid data type!\n",0x28,1,_stderr);
      exit(1);
    }
    iVar4 = *(int *)((long)__return_storage_ptr__ + 8);
    if (iVar4 == 0x10) {
      plVar5 = *(longdouble **)__return_storage_ptr__;
      puVar1 = (undefined8 *)((long)&field->offset + (long)plVar5);
      _tmp = (longdouble *)*puVar1;
      uStack_30 = puVar1[1];
      if (*(char *)(__return_storage_ptr__ + 1) != '\0') {
        byte_swap((char *)&tmp,0x10);
        plVar5 = extraout_RAX_00;
      }
    }
    else if (iVar4 == 8) {
      plVar5 = *(longdouble **)((long)&field->offset + *(long *)__return_storage_ptr__);
      bVar2 = *(byte *)((long)__return_storage_ptr__ + 0x11);
      bVar3 = *(byte *)((long)__return_storage_ptr__ + 0x12);
      if (bVar2 != bVar3) {
        _tmp = plVar5;
        if (fm_reverse_float_formats[(uint)bVar3] == (uint)bVar2) {
          iVar4 = 8;
        }
        else {
          uVar6 = (uint)bVar2 << 0x10 | (uint)bVar3;
          if (uVar6 != 0x10003) {
            if (uVar6 == 0x20003) {
              return plVar5;
            }
            if (uVar6 == 0x30002) {
              return plVar5;
            }
            if (uVar6 != 0x30001) {
              iVar4 = puts("unanticipated float conversion ");
              return (longdouble *)CONCAT44(extraout_var_00,iVar4);
            }
          }
          iVar4 = 4;
          byte_swap((char *)&tmp,4);
          data_00 = (float *)acStack_34;
        }
        byte_swap((char *)data_00,iVar4);
        plVar5 = extraout_RAX_01;
      }
    }
    else if (iVar4 == 4) {
      uVar6 = *(uint *)((long)&field->offset + *(long *)__return_storage_ptr__);
      plVar5 = (longdouble *)(ulong)uVar6;
      _tmp = (longdouble *)CONCAT44(acStack_34,uVar6);
      if (*(char *)(__return_storage_ptr__ + 1) != '\0') {
        byte_swap((char *)&tmp,4);
        plVar5 = extraout_RAX;
      }
    }
    else if (get_big_float::get_double_warn == 0) {
      iVar4 = fprintf(_stderr,"Get Double failed!  Size problems.  File double size is %d.\n");
      plVar5 = (longdouble *)CONCAT44(extraout_var,iVar4);
      get_big_float::get_double_warn = get_big_float::get_double_warn + 1;
    }
  }
  return plVar5;
}

Assistant:

static MAX_FLOAT_TYPE
get_big_float(FMFieldPtr field, void *data)
{
    if (field->data_type == float_type) {
	if (field->size == sizeof(float)) {
	    float tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(float));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(float));
	    tmp2 = tmp;
	    return tmp2;
	} else if (field->size == sizeof(double)) {
	    double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(double));
	    float_conversion((unsigned char *)&tmp, sizeof(double), 
			     (FMfloat_format)field->src_float_format,
			     (FMfloat_format)field->target_float_format);
	    tmp2 = tmp;
	    return tmp2;
#if SIZEOF_LONG_DOUBLE != 0
	} else if (field->size == sizeof(long double)) {
	    long double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset),
		   sizeof(long double));
	    if (field->byte_swap)
		byte_swap((char *) &tmp,
			  (int)sizeof(long double));
	    tmp2 = tmp;
	    return tmp2;
#endif
	} else {
	    static int get_double_warn = 0;
	    if (!get_double_warn) {
		fprintf(stderr, "Get Double failed!  Size problems.  File double size is %d.\n", field->size);
		get_double_warn++;
	    }
	    return 0.0;
	}
    } else if (field->data_type == integer_type) {
	MAX_INTEGER_TYPE tmp = get_big_int(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	/* 
	 * A concession to inter-compiler interoperability...  We
	 * shouldn't need the (double)(long) casts here.  If we don't
	 * use them, AND we're on a machine which doesn't support "long 
	 * long" and "long double" in native code, gcc generates calls 
	 * to libgcc and the resulting library can't be linked with
	 * anything but GCC.  This can be a problem for installed
	 * libraries.  Using the casts avoids that particular problem,
	 * at a cost of data loss in the case of someone converting a
	 * "long long" that doesn't fit in a long to a floating point
	 * value. 
	 */
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get Double failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}